

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

bool verify_Board(vector<Board,_std::allocator<Board>_> *puzzles,Board *board,int posi)

{
  pointer pBVar1;
  bool bVar2;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  Board local_90;
  vector<Board,_std::allocator<Board>_> *local_58;
  Board *local_50;
  ulong local_48;
  long local_40;
  undefined4 local_34;
  
  if (posi < 1) {
    local_34 = 1;
  }
  else {
    local_48 = (ulong)(uint)posi;
    local_40 = -local_48;
    lVar5 = 0x20;
    uVar6 = 1;
    local_34 = 0;
    local_58 = puzzles;
    local_50 = board;
    do {
      pBVar1 = (local_58->super__Vector_base<Board,_std::allocator<Board>_>)._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<Ship,_std::allocator<Ship>_>::vector
                (&local_90.armada,
                 (vector<Ship,_std::allocator<Ship>_> *)((long)pBVar1 + lVar5 + -0x20));
      local_90._24_8_ = *(undefined8 *)((long)pBVar1 + lVar5 + -8);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::vector(&local_90.matrix,
               (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)((long)&(pBVar1->armada).super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl +
                  lVar5));
      bVar2 = Board::operator==(local_50,&local_90);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(&local_90.matrix);
      uVar3 = extraout_RAX;
      if (local_90.armada.super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.armada.super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
                        super__Vector_impl_data._M_start);
        uVar3 = extraout_RAX_00;
      }
      if (bVar2) break;
      local_34 = (undefined4)CONCAT71((int7)((ulong)uVar3 >> 8),local_48 <= uVar6);
      lVar5 = lVar5 + 0x38;
      lVar4 = local_40 + uVar6;
      uVar6 = uVar6 + 1;
    } while (lVar4 != 0);
  }
  return (bool)((byte)local_34 & 1);
}

Assistant:

bool verify_Board( std::vector< Board > &puzzles, Board board, int posi )
{
    for( int vec = 0; vec < posi; vec++ )
    {
        if( board == puzzles[vec] )
        {
            return false;
        }
    }

    return true;
}